

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *
loadDirectory(vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *__return_storage_ptr__,char *path)

{
  bool bVar1;
  DIR *__dirp;
  char *pcVar2;
  dirent *pdVar3;
  SVG *pSVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  SVG *local_c0;
  SVG *svg;
  string filesufx;
  undefined1 local_90 [8];
  string filename;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string pathname;
  size_t n;
  dirent *ent;
  DIR *dir;
  char *path_local;
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *svgs;
  
  __dirp = opendir(path);
  std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector(__return_storage_ptr__);
  if (__dirp == (DIR *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
    poVar5 = std::operator<<(poVar5,"Could not open directory");
    poVar5 = std::operator<<(poVar5,path);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    pathname.field_2._8_8_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,path,&local_59);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
    if (*pcVar2 != '/') {
      std::__cxx11::string::push_back((char)local_58);
    }
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0 && (ulong)pathname.field_2._8_8_ < 9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,pdVar3->d_name,
                 (allocator<char> *)(filesufx.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(filesufx.field_2._M_local_buf + 0xf));
      std::__cxx11::string::find_last_of(local_90,0x20f46e);
      std::__cxx11::string::substr((ulong)&svg,(ulong)local_90);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &svg,"svg");
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] Loading ");
        poVar5 = std::operator<<(poVar5,(string *)local_90);
        std::operator<<(poVar5,"... ");
        std::operator+(&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pSVar4 = loadFile(pcVar2);
        std::__cxx11::string::~string((string *)&local_e0);
        local_c0 = pSVar4;
        if (pSVar4 == (SVG *)0x0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Failed (Invalid SVG file)");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Succeeded");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::push_back
                    (__return_storage_ptr__,&local_c0);
          pathname.field_2._8_8_ = pathname.field_2._8_8_ + 1;
        }
      }
      std::__cxx11::string::~string((string *)&svg);
      std::__cxx11::string::~string((string *)local_90);
    }
    closedir(__dirp);
    if (pathname.field_2._8_8_ == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      poVar5 = std::operator<<(poVar5,"No valid svg files found in ");
      poVar5 = std::operator<<(poVar5,path);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"[Drawer] ");
      poVar5 = std::operator<<(poVar5,"Successfully Loaded ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pathname.field_2._8_8_);
      poVar5 = std::operator<<(poVar5," files from ");
      poVar5 = std::operator<<(poVar5,path);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SVG*> loadDirectory( const char* path ) {

  DIR *dir = opendir (path);
  vector<SVG*> svgs;
  if(dir) {
    
    struct dirent *ent; size_t n = 0;
    
    // load files
    string pathname = path; 
    if (pathname[pathname.size()-1] != '/') pathname.push_back('/');
    while (((ent = readdir (dir)) != NULL) && (n < 9)) {

      string filename = ent->d_name;
      string filesufx = filename.substr(filename.find_last_of(".") + 1, 3);
      if (filesufx == "svg" ) {
        cerr << "[Drawer] Loading " << filename << "... "; 
        SVG *svg = loadFile((pathname + filename).c_str());
        if (!svg) {
          cerr << "Failed (Invalid SVG file)" << endl;
        } else {
          cerr << "Succeeded" << endl;
          svgs.push_back(svg);
          n++;
        }
      }
    }

    closedir (dir);

    if (n) {
      msg("Successfully Loaded " << n << " files from " << path);
      return svgs;
    }

    msg("No valid svg files found in " << path);
    return svgs;
  } 

  msg("Could not open directory" << path);
  return svgs;
}